

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

bool __thiscall QGraphicsProxyWidget::event(QGraphicsProxyWidget *this,QEvent *event)

{
  ushort uVar1;
  QGraphicsProxyWidgetPrivate *this_00;
  Data *pDVar2;
  QWidgetPrivate *pQVar3;
  char cVar4;
  bool bVar5;
  QEvent QVar6;
  uint uVar7;
  ulong uVar8;
  QWidget *pQVar9;
  QWidget *pQVar10;
  QStyle *style;
  QTouchEvent *touchEvent;
  QObject *pQVar11;
  long in_FS_OFFSET;
  QPointF QVar12;
  QPoint pos;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  QPointF local_60;
  QPointF local_50;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  pDVar2 = (this_00->widget).wp.d;
  if (((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) ||
     (pQVar9 = (QWidget *)(this_00->widget).wp.value, pQVar9 == (QWidget *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar5 = QGraphicsWidget::event((QGraphicsWidget *)this,event);
      return bVar5;
    }
    goto LAB_005fa0ce;
  }
  uVar1 = *(ushort *)(event + 8);
  uVar7 = (uint)uVar1;
  if (uVar1 < 100) {
    if (uVar1 < 0x33) {
      if (uVar1 - 0x18 < 2) {
        if (*(int *)(pDVar2 + 4) == 0) {
          pQVar9 = (QWidget *)0x0;
        }
        QCoreApplication::sendEvent(&pQVar9->super_QObject,event);
      }
      else if (uVar7 == 6) {
        if ((*(int *)(event + 0x40) + 0xfeffffffU < 2) &&
           (uVar8 = QKeyEvent::modifiers(), (uVar8 & 0xc000000) == 0)) {
          pQVar9 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
          QVar6 = (QEvent)0x1;
          if (pQVar9 != (QWidget *)0x0) {
            do {
              cVar4 = QCoreApplication::sendEvent(&pQVar9->super_QObject,event);
              if ((cVar4 != '\0') && (event[0xc] != (QEvent)0x0)) {
LAB_005fa0c5:
                event[0xc] = (QEvent)0x1;
                break;
              }
              bVar5 = QGraphicsItem::isWindow((QGraphicsItem *)(this + 0x10));
              if (bVar5) {
                pDVar2 = (this_00->widget).wp.d;
                if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
                  pQVar10 = (QWidget *)0x0;
                }
                else {
                  pQVar10 = (QWidget *)(this_00->widget).wp.value;
                }
                if (pQVar10 == pQVar9) goto LAB_005fa0c5;
              }
              pQVar9 = *(QWidget **)(*(long *)&pQVar9->field_0x8 + 0x10);
            } while (pQVar9 != (QWidget *)0x0);
          }
          goto LAB_005f9fef;
        }
      }
      else if (uVar7 == 0x27) {
        pQVar3 = *(QWidgetPrivate **)&pQVar9->field_0x8;
        uVar7 = QPalette::resolveMask();
        pQVar3->inheritedPaletteResolveMask =
             (long)(int)(uVar7 | (this_00->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask
                        );
        QWidgetPrivate::resolvePalette(pQVar3);
      }
      goto LAB_005f9fe2;
    }
    if (uVar7 == 0x33) {
      pQVar9 = QWidget::focusWidget(pQVar9);
      if (pQVar9 == (QWidget *)0x0) {
        QVar6 = (QEvent)0x0;
      }
      else {
        do {
          QCoreApplication::sendEvent(&pQVar9->super_QObject,event);
          QVar6 = event[0xc];
          if (QVar6 != (QEvent)0x0) break;
          pQVar9 = *(QWidget **)(*(long *)&pQVar9->field_0x8 + 0x10);
        } while (pQVar9 != (QWidget *)0x0);
      }
    }
    else {
      if (uVar7 != 0x53) {
        if (uVar7 == 0x61) {
          pQVar3 = *(QWidgetPrivate **)&pQVar9->field_0x8;
          pQVar3->inheritedFontResolveMask =
               (this_00->super_QGraphicsWidgetPrivate).inheritedFontResolveMask |
               *(uint *)&(this_00->super_QGraphicsWidgetPrivate).field_0x1a8;
          QWidgetPrivate::resolveFont(pQVar3);
        }
        goto LAB_005f9fe2;
      }
      (**(code **)(*(long *)this + 0x1c8))(this,event);
      QVar6 = event[0xc];
    }
  }
  else {
    if (uVar1 < 0xc2) {
      if (uVar7 == 100) {
        if ((*(ushort *)&this_00->field_0x244 & 0x300) == 0) {
          *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 | 0x100;
          if (*(int *)(pDVar2 + 4) == 0) {
            pQVar9 = (QWidget *)0x0;
          }
          style = QGraphicsWidget::style((QGraphicsWidget *)this);
          QWidget::setStyle(pQVar9,style);
          this_00->field_0x245 = this_00->field_0x245 & 0xfc;
        }
      }
      else if (uVar7 == 0xa3) {
        pDVar2 = (this_00->lastWidgetUnderMouse).wp.d;
        if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
           ((this_00->lastWidgetUnderMouse).wp.value != (QObject *)0x0)) {
          local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          QVar12 = QGraphicsSceneHelpEvent::scenePos((QGraphicsSceneHelpEvent *)event);
          local_60.yp = QVar12.yp;
          local_60.xp = QVar12.xp;
          QVar12 = QGraphicsItem::mapFromScene((QGraphicsItem *)(this + 0x10),&local_60);
          local_50.yp = QVar12.yp;
          local_50.xp = QVar12.xp;
          pDVar2 = (this_00->lastWidgetUnderMouse).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar9 = (QWidget *)0x0;
          }
          else {
            pQVar9 = (QWidget *)(this_00->lastWidgetUnderMouse).wp.value;
          }
          QVar12 = QGraphicsProxyWidgetPrivate::mapToReceiver(this_00,&local_50,pQVar9);
          local_88._8_8_ = QVar12.yp;
          local_88._0_8_ = QVar12.xp;
          local_40 = QPointF::toPoint((QPointF *)local_88);
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_50.xp = (qreal)QGraphicsSceneHelpEvent::screenPos((QGraphicsSceneHelpEvent *)event);
          QHelpEvent::QHelpEvent((QHelpEvent *)local_88,ToolTip,&local_40,(QPoint *)&local_50);
          pDVar2 = (this_00->lastWidgetUnderMouse).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar11 = (QObject *)0x0;
          }
          else {
            pQVar11 = (this_00->lastWidgetUnderMouse).wp.value;
          }
          QCoreApplication::sendEvent(pQVar11,(QEvent *)local_88);
          (**(code **)(*(long *)event + 0x10))(event,local_88[0xc]);
          QVar6 = local_88[0xc];
          QHelpEvent::~QHelpEvent((QHelpEvent *)local_88);
          goto LAB_005f9fef;
        }
      }
      else if ((uVar7 == 0xb8) && ((*(ushort *)&this_00->field_0x244 & 0x3000) == 0)) {
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 | 0x1000;
        if (*(int *)(pDVar2 + 4) == 0) {
          pQVar9 = (QWidget *)0x0;
        }
        QGraphicsItem::toolTip((QString *)local_88,(QGraphicsItem *)(this + 0x10));
        QWidget::setToolTip(pQVar9,(QString *)local_88);
        if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        this_00->field_0x245 = this_00->field_0x245 & 0xcf;
      }
    }
    else if (uVar7 - 0xc2 < 3) {
      if (*(int *)(pDVar2 + 4) == 0) {
        pQVar9 = (QWidget *)0x0;
      }
      bVar5 = QApplicationPrivate::translateRawTouchEvent(pQVar9,(QTouchEvent *)event);
      if ((bVar5) && (QVar6 = (QEvent)0x1, event[0xc] != (QEvent)0x0)) goto LAB_005f9fef;
    }
LAB_005f9fe2:
    QVar6 = (QEvent)QGraphicsWidget::event((QGraphicsWidget *)this,event);
  }
LAB_005f9fef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)QVar6;
  }
LAB_005fa0ce:
  __stack_chk_fail();
}

Assistant:

bool QGraphicsProxyWidget::event(QEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (!d->widget)
        return QGraphicsWidget::event(event);

    switch (event->type()) {
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        QCoreApplication::sendEvent(d->widget, event);
        break;
    case QEvent::StyleChange:
        // Propagate style changes to the embedded widget.
        if (!d->styleChangeMode) {
            d->styleChangeMode = QGraphicsProxyWidgetPrivate::ProxyToWidgetMode;
            d->widget->setStyle(style());
            d->styleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
        }
        break;
    case QEvent::FontChange: {
        // Propagate to widget.
        QWidgetPrivate *wd = d->widget->d_func();
        int mask = d->font.resolveMask() | d->inheritedFontResolveMask;
        wd->inheritedFontResolveMask = mask;
        wd->resolveFont();
        break;
    }
    case QEvent::PaletteChange: {
        // Propagate to widget.
        QWidgetPrivate *wd = d->widget->d_func();
        int mask = d->palette.resolveMask() | d->inheritedPaletteResolveMask;
        wd->inheritedPaletteResolveMask = mask;
        wd->resolvePalette();
        break;
    }
    case QEvent::InputMethod: {
        inputMethodEvent(static_cast<QInputMethodEvent *>(event));
        if (event->isAccepted())
            return true;
        return false;
    }
    case QEvent::ShortcutOverride: {
        QWidget *focusWidget = d->widget->focusWidget();
        while (focusWidget) {
            QCoreApplication::sendEvent(focusWidget, event);
            if (event->isAccepted())
                return true;
            focusWidget = focusWidget->parentWidget();
        }
        return false;
    }
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent *>(event);
        if (k->key() == Qt::Key_Tab || k->key() == Qt::Key_Backtab) {
            if (!(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier))) {  //### Add MetaModifier?
                QWidget *focusWidget = d->widget->focusWidget();
                while (focusWidget) {
                    const bool res = QCoreApplication::sendEvent(focusWidget, event);
                    if ((res && event->isAccepted()) || (isWindow() && focusWidget == d->widget)) {
                        event->accept();
                        break;
                    }
                    focusWidget = focusWidget->parentWidget();
                }
                return true;
            }
        }
        break;
    }
#if QT_CONFIG(tooltip)
    case QEvent::GraphicsSceneHelp: {
        // Propagate the help event (for tooltip) to the widget under mouse
        if (d->lastWidgetUnderMouse) {
            QGraphicsSceneHelpEvent *he = static_cast<QGraphicsSceneHelpEvent *>(event);
            QPoint pos = d->mapToReceiver(mapFromScene(he->scenePos()), d->lastWidgetUnderMouse).toPoint();
            QHelpEvent e(QEvent::ToolTip, pos, he->screenPos());
            QCoreApplication::sendEvent(d->lastWidgetUnderMouse, &e);
            event->setAccepted(e.isAccepted());
            return e.isAccepted();
        }
        break;
    }
    case QEvent::ToolTipChange: {
        // Propagate tooltip change to the widget
        if (!d->tooltipChangeMode) {
            d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::ProxyToWidgetMode;
            d->widget->setToolTip(toolTip());
            d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
        }
        break;
    }
#endif
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd: {
        QTouchEvent *touchEvent = static_cast<QTouchEvent *>(event);
        bool res = QApplicationPrivate::translateRawTouchEvent(d->widget, touchEvent);
        if (res & touchEvent->isAccepted())
            return true;

        break;
    }
    default:
        break;
    }
    return QGraphicsWidget::event(event);
}